

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullStore.cpp
# Opt level: O0

MessageStore * __thiscall
FIX::NullStoreFactory::create(NullStoreFactory *this,UtcTimeStamp *now,SessionID *param_2)

{
  NullStore *this_00;
  SessionID *param_2_local;
  UtcTimeStamp *now_local;
  NullStoreFactory *this_local;
  
  this_00 = (NullStore *)operator_new(0x30);
  NullStore::NullStore(this_00,now);
  return &this_00->super_MessageStore;
}

Assistant:

MessageStore *NullStoreFactory::create(const UtcTimeStamp &now, const SessionID &) { return new NullStore(now); }